

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

type __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,Rml::FilterInstancer*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::doCreateByKey<std::__cxx11::string,Rml::FilterInstancer*>
          (Table<true,80ul,std::__cxx11::string,Rml::FilterInstancer*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  InfoType IVar1;
  size_t insertion_idx;
  __type _Var2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*>
  *this_00;
  InfoType info;
  size_t idx;
  InfoType local_6c;
  size_t local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*>
  local_58;
  
  do {
    local_68 = 0;
    local_6c = 0;
    keyToIdx<std::__cxx11::string&>(this,key,&local_68,&local_6c);
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::nextWhileLess((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,&local_6c,&local_68);
    for (; insertion_idx = local_68, IVar1 = local_6c,
        local_6c == *(byte *)(*(long *)(this + 8) + local_68);
        local_6c = local_6c + *(int *)(this + 0x28)) {
      _Var2 = std::operator==(key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_68 * 0x28 + *(long *)this));
      if (_Var2) {
        lVar3 = *(long *)this + local_68 * 0x28;
        goto LAB_002a41f8;
      }
      local_68 = local_68 + 1;
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      uVar4 = *(int *)(this + 0x28) + local_6c;
      if (0xff < uVar4) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar3 = 0;
      for (; uVar5 = uVar4, *(char *)(*(long *)(this + 8) + local_68) != '\0';
          local_68 = local_68 + 1) {
        lVar3 = lVar3 + -1;
        uVar4 = uVar5 + *(int *)(this + 0x28);
        local_6c = uVar5;
      }
      this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*>
                 *)(*(long *)this + insertion_idx * 0x28);
      if (lVar3 == 0) {
        local_58.first._M_dataplus._M_p = (pointer)key;
        pair<std::__cxx11::string,Rml::FilterInstancer*>::pair<std::__cxx11::string&&>
                  ((pair<std::__cxx11::string,Rml::FilterInstancer*> *)this_00);
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,local_68,insertion_idx);
        local_60 = key;
        pair<std::__cxx11::string,Rml::FilterInstancer*>::pair<std::__cxx11::string&&>
                  ((pair<std::__cxx11::string,Rml::FilterInstancer*> *)&local_58);
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*>
        ::operator=(this_00,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)IVar1;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      lVar3 = *(long *)this + insertion_idx * 0x28;
LAB_002a41f8:
      return (type)(lVar3 + 0x20);
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  } while( true );
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }